

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O2

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)

{
  SQChar *pSVar1;
  SQFUNCTION p_Var2;
  long lVar3;
  
  sq_pushstring(v,"regexp",-1);
  sq_newclass(v,0);
  for (lVar3 = 0x18; lVar3 != 0xd8; lVar3 = lVar3 + 0x20) {
    pSVar1 = *(SQChar **)((long)&_stream_methods[10].f + lVar3);
    p_Var2 = *(SQFUNCTION *)((long)&_stream_methods[10].nparamscheck + lVar3);
    sq_pushstring(v,pSVar1,-1);
    sq_newclosure(v,p_Var2,0);
    sq_setparamscheck(v,*(SQInteger *)((long)&_stream_methods[10].typemask + lVar3),
                      *(SQChar **)((long)&rexobj_funcs[0].name + lVar3));
    sq_setnativeclosurename(v,-1,pSVar1);
    sq_newslot(v,-3,0);
  }
  sq_newslot(v,-3,0);
  for (lVar3 = 0x18; lVar3 != 0x138; lVar3 = lVar3 + 0x20) {
    pSVar1 = *(SQChar **)((long)&rexobj_funcs[6].f + lVar3);
    p_Var2 = *(SQFUNCTION *)((long)&rexobj_funcs[6].nparamscheck + lVar3);
    sq_pushstring(v,pSVar1,-1);
    sq_newclosure(v,p_Var2,0);
    sq_setparamscheck(v,*(SQInteger *)((long)&rexobj_funcs[6].typemask + lVar3),
                      *(SQChar **)((long)&stringlib_funcs[0].name + lVar3));
    sq_setnativeclosurename(v,-1,pSVar1);
    sq_newslot(v,-3,0);
  }
  return 1;
}

Assistant:

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)
{
    sq_pushstring(v,_SC("regexp"),-1);
    sq_newclass(v,SQFalse);
    SQInteger i = 0;
    while(rexobj_funcs[i].name != 0) {
        const SQRegFunction &f = rexobj_funcs[i];
        sq_pushstring(v,f.name,-1);
        sq_newclosure(v,f.f,0);
        sq_setparamscheck(v,f.nparamscheck,f.typemask);
        sq_setnativeclosurename(v,-1,f.name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_newslot(v,-3,SQFalse);

    i = 0;
    while(stringlib_funcs[i].name!=0)
    {
        sq_pushstring(v,stringlib_funcs[i].name,-1);
        sq_newclosure(v,stringlib_funcs[i].f,0);
        sq_setparamscheck(v,stringlib_funcs[i].nparamscheck,stringlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,stringlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}